

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::AddDefaultExtraGenerators(cmake *this)

{
  mapped_type *pp_Var1;
  key_type local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  cmake *local_10;
  cmake *this_local;
  
  local_10 = this;
  cmExtraCodeBlocksGenerator::GetActualName_abi_cxx11_();
  AddExtraGenerator(this,&local_30,cmExtraCodeBlocksGenerator::New);
  std::__cxx11::string::~string((string *)&local_30);
  cmExtraCodeLiteGenerator::GetActualName_abi_cxx11_();
  AddExtraGenerator(this,&local_60,cmExtraCodeLiteGenerator::New);
  std::__cxx11::string::~string((string *)&local_60);
  cmExtraSublimeTextGenerator::GetActualName_abi_cxx11_();
  AddExtraGenerator(this,&local_80,cmExtraSublimeTextGenerator::New);
  std::__cxx11::string::~string((string *)&local_80);
  cmExtraKateGenerator::GetActualName_abi_cxx11_();
  AddExtraGenerator(this,&local_a0,cmExtraKateGenerator::New);
  std::__cxx11::string::~string((string *)&local_a0);
  cmExtraEclipseCDT4Generator::GetActualName_abi_cxx11_();
  AddExtraGenerator(this,&local_c0,cmExtraEclipseCDT4Generator::New);
  std::__cxx11::string::~string((string *)&local_c0);
  cmGlobalKdevelopGenerator::GetActualName_abi_cxx11_();
  AddExtraGenerator(this,&local_e0,cmGlobalKdevelopGenerator::New);
  std::__cxx11::string::~string((string *)&local_e0);
  cmGlobalKdevelopGenerator::GetActualName_abi_cxx11_();
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
            ::operator[](&this->ExtraGenerators,&local_100);
  *pp_Var1 = cmGlobalKdevelopGenerator::New;
  std::__cxx11::string::~string((string *)&local_100);
  return;
}

Assistant:

void cmake::AddDefaultExtraGenerators()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
#if defined(_WIN32) && !defined(__CYGWIN__)
  // e.g. kdevelop4 ?
#endif

  this->AddExtraGenerator(cmExtraCodeBlocksGenerator::GetActualName(),
                          &cmExtraCodeBlocksGenerator::New);
  this->AddExtraGenerator(cmExtraCodeLiteGenerator::GetActualName(),
                          &cmExtraCodeLiteGenerator::New);
  this->AddExtraGenerator(cmExtraSublimeTextGenerator::GetActualName(),
                          &cmExtraSublimeTextGenerator::New);
  this->AddExtraGenerator(cmExtraKateGenerator::GetActualName(),
                          &cmExtraKateGenerator::New);

#ifdef CMAKE_USE_ECLIPSE
  this->AddExtraGenerator(cmExtraEclipseCDT4Generator::GetActualName(),
                          &cmExtraEclipseCDT4Generator::New);
#endif

#ifdef CMAKE_USE_KDEVELOP
  this->AddExtraGenerator(cmGlobalKdevelopGenerator::GetActualName(),
                          &cmGlobalKdevelopGenerator::New);
  // for kdevelop also add the generator with just the name of the
  // extra generator, since it was this way since cmake 2.2
  this->ExtraGenerators[cmGlobalKdevelopGenerator::GetActualName()]
                                             = &cmGlobalKdevelopGenerator::New;
#endif

#endif
}